

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void name_cb(Fl_Input *o,void *v)

{
  int iVar1;
  undefined4 extraout_var;
  
  if ((char *)v == "LOAD") {
    if (numselected == 1) {
      Fl_Input_::static_value(&o->super_Fl_Input_,(current_widget->super_Fl_Type).name_);
      (*(o->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[5])(o);
      iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[4])();
      snprintf(name_cb::buf,0x400,"%s Properties",CONCAT44(extraout_var,iVar1));
    }
    else {
      snprintf(name_cb::buf,0x400,"Widget Properties (%d widgets)");
      (*(o->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])(o);
    }
    Fl_Window::label(the_panel,name_cb::buf);
    return;
  }
  if (numselected == 1) {
    Fl_Type::name(&current_widget->super_Fl_Type,(o->super_Fl_Input_).value_);
    return;
  }
  return;
}

Assistant:

void name_cb(Fl_Input* o, void *v) {
  if (v == LOAD) {
    static char buf[1024];
    if (numselected != 1) {
      snprintf(buf, sizeof(buf), "Widget Properties (%d widgets)", numselected);
      o->hide();
    } else {
      o->static_value(current_widget->name());
      o->show();
      snprintf(buf, sizeof(buf), "%s Properties", current_widget->title());
    }

    the_panel->label(buf);
  } else {
    if (numselected == 1) {
      current_widget->name(o->value());
      // I don't update window title, as it probably is being closed
      // and wm2 (a window manager) barfs if you retitle and then
      // hide a window:
      // ((Fl_Window*)(o->parent()->parent()->parent()))->label(current_widget->title());
    }
  }
}